

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_user_exception_ls(sexp ctx,sexp self,char *msg,int n,...)

{
  char in_AL;
  sexp psVar1;
  sexp *ppsVar2;
  undefined1 *n_00;
  ulong uVar3;
  sexp *n_01;
  undefined1 *extraout_RDX;
  int iVar4;
  sexp in_R8;
  sexp in_R9;
  sexp in_XMM0_Qa;
  size_t in_XMM1_Qa;
  sexp in_XMM2_Qa;
  sexp_proc2 in_XMM3_Qa;
  sexp_conflict *in_XMM4_Qa;
  sexp_conflict *in_XMM5_Qa;
  sexp_mark_stack_ptr_t *in_XMM6_Qa;
  sexp_conflict *in_XMM7_Qa;
  sexp ir;
  sexp res;
  va_list ap;
  sexp local_128;
  undefined8 local_120;
  ulong local_118;
  sexp *local_110;
  undefined1 *local_108;
  undefined8 *local_f8;
  sexp_gc_var_t *local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  n_00 = &stack0xffffffffffffff28;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8 = &local_120;
  local_120 = 0x43e;
  local_e0 = &local_f8;
  local_f0 = (ctx->value).context.saves;
  psVar1 = (sexp)&local_e8;
  (ctx->value).context.saves = (sexp_gc_var_t *)psVar1;
  local_110 = &res;
  local_118 = 0x3000000020;
  local_128 = (sexp)&DAT_0000023e;
  iVar4 = 0;
  local_108 = n_00;
  local_e8 = (undefined1 *)&local_128;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (0 < n) {
    iVar4 = n;
    local_e8 = (undefined1 *)&local_128;
  }
  while (iVar4 != 0) {
    uVar3 = local_118 & 0xffffffff;
    if (uVar3 < 0x29) {
      n_01 = (sexp *)(ulong)((int)local_118 + 8U);
      local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8U);
      ppsVar2 = (sexp *)(local_108 + uVar3);
    }
    else {
      n_01 = local_110 + 1;
      ppsVar2 = local_110;
      local_110 = n_01;
    }
    local_128 = sexp_cons_op(ctx,psVar1,(sexp_sint_t)n_01,*ppsVar2,local_128);
    n_00 = extraout_RDX;
    iVar4 = iVar4 + -1;
  }
  local_128 = sexp_nreverse_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,local_128);
  psVar1 = sexp_user_exception(ctx,self,msg,local_128);
  (ctx->value).context.saves = local_f0;
  return psVar1;
}

Assistant:

sexp sexp_user_exception_ls (sexp ctx, sexp self, const char *msg, int n, ...) {
  int i;
  va_list ap;
  sexp_gc_var2(res, ir);
  sexp_gc_preserve2(ctx, res, ir);
  va_start(ap, n);
  for (i=0, ir=SEXP_NULL; i < n; ++i) {
    ir = sexp_cons(ctx, va_arg(ap, sexp), ir);
  }
  ir = sexp_nreverse(ctx, ir);
  res = sexp_user_exception(ctx, self, msg, ir);
  sexp_gc_release2(ctx);
  va_end(ap);
  return res;
}